

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

bool __thiscall FakeCommandRunner::StartCommand(FakeCommandRunner *this,Edge *edge)

{
  int *piVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  iterator __position;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> __first;
  VirtualFileSystem *pVVar4;
  Node *pNVar5;
  long lVar6;
  Edge *pEVar7;
  int iVar8;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> _Var9;
  ulong uVar10;
  long *plVar11;
  size_type *psVar12;
  pointer ppNVar13;
  char *__end;
  string depfile;
  string dep;
  string contents;
  Edge *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppEVar2 = (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar3 = (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_f8 = edge;
  if (this->max_active_edges_ <= (ulong)((long)ppEVar3 - (long)ppEVar2 >> 3)) {
    __assert_fail("active_edges_.size() < max_active_edges_",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                  ,0x24c,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
  }
  _Var9 = std::
          __find_if<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_equals_val<Edge*const>>
                    (ppEVar2,ppEVar3,&local_f8);
  if (_Var9._M_current !=
      (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("find(active_edges_.begin(), active_edges_.end(), edge) == active_edges_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                  ,0x24e,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
  }
  Edge::EvaluateCommand_abi_cxx11_(&local_d0,local_f8,false);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->commands_ran_,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_);
  if (((((iVar8 == 0) ||
        (iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar8 == 0)) ||
       (iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar8 == 0)) ||
      (((iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar8 == 0 ||
        (iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar8 == 0)) ||
       ((iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar8 == 0 ||
        ((iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar8 == 0 ||
         (iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar8 == 0)))))))) ||
     (iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar8 == 0)) {
    ppNVar13 = (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppNVar13 !=
        (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pVVar4 = this->fs_;
        pNVar5 = *ppNVar13;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"","");
        VirtualFileSystem::Create(pVVar4,&pNVar5->path_,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,
                          CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                   local_d0.field_2._M_local_buf[0]) + 1);
        }
        ppNVar13 = ppNVar13 + 1;
      } while (ppNVar13 !=
               (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    goto LAB_00128fad;
  }
  iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_);
  if ((((iVar8 == 0) || (iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar8 == 0)
       ) || (iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar8 == 0)) ||
     (iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_), iVar8 == 0))
  goto LAB_00128fad;
  iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_);
  if (iVar8 == 0) {
    ppNVar13 = (local_f8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppNVar13 ==
        (local_f8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("!edge->inputs_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                    ,0x263,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
    }
    if ((long)(local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start != 8) {
      __assert_fail("edge->outputs_.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                    ,0x264,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    iVar8 = (*(this->fs_->super_DiskInterface).super_FileReader._vptr_FileReader[2])
                      (this->fs_,*ppNVar13,&local_d0,&local_f0);
    if (iVar8 == 0) {
      (*(this->fs_->super_DiskInterface).super_FileReader._vptr_FileReader[5])
                (this->fs_,
                 *(local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start,&local_d0);
    }
LAB_00129515:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
LAB_0012951f:
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_);
    pEVar7 = local_f8;
    if (iVar8 != 0) {
      iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_);
      pEVar7 = local_f8;
      if (iVar8 != 0) {
        iVar8 = std::__cxx11::string::compare((char *)local_f8->rule_);
        pEVar7 = local_f8;
        if (iVar8 != 0) {
          puts("unknown command");
          return false;
        }
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test_dependency","");
        Edge::GetBinding(&local_d0,pEVar7,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,
                          CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                   local_f0.field_2._M_local_buf[0]) + 1);
        }
        Edge::GetUnescapedDepfile_abi_cxx11_(&local_f0,local_f8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        ppNVar13 = (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (ppNVar13 !=
            (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            std::operator+(&local_70,&(*ppNVar13)->path_,": ");
            std::operator+(&local_50,&local_70,&local_d0);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            psVar12 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_b0.field_2._M_allocated_capacity = *psVar12;
              local_b0.field_2._8_8_ = plVar11[3];
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar12;
              local_b0._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_b0._M_string_length = plVar11[1];
            *plVar11 = (long)psVar12;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            pVVar4 = this->fs_;
            pNVar5 = *ppNVar13;
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
            VirtualFileSystem::Create(pVVar4,&pNVar5->path_,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            ppNVar13 = ppNVar13 + 1;
          } while (ppNVar13 !=
                   (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        VirtualFileSystem::Create(this->fs_,&local_f0,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_00129515;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test_dependency","");
      Edge::GetBinding(&local_d0,pEVar7,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,
                        CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                 local_f0.field_2._M_local_buf[0]) + 1);
      }
      ppNVar13 = (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppNVar13 !=
          (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          pVVar4 = this->fs_;
          pNVar5 = *ppNVar13;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"","");
          VirtualFileSystem::Create(pVVar4,&pNVar5->path_,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,
                            CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                     local_f0.field_2._M_local_buf[0]) + 1);
          }
          ppNVar13 = ppNVar13 + 1;
        } while (ppNVar13 !=
                 (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      pVVar4 = this->fs_;
      piVar1 = &pVVar4->now_;
      *piVar1 = *piVar1 + 1;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
      VirtualFileSystem::Create(pVVar4,&local_d0,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_0012952c;
      goto LAB_0012951f;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test_dependency","");
    Edge::GetBinding(&local_d0,pEVar7,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    pVVar4 = this->fs_;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    VirtualFileSystem::Create(pVVar4,&local_d0,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    piVar1 = &this->fs_->now_;
    *piVar1 = *piVar1 + 1;
    ppNVar13 = (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppNVar13 !=
        (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pVVar4 = this->fs_;
        pNVar5 = *ppNVar13;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"","");
        VirtualFileSystem::Create(pVVar4,&pNVar5->path_,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,
                          CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                   local_f0.field_2._M_local_buf[0]) + 1);
        }
        ppNVar13 = ppNVar13 + 1;
      } while (ppNVar13 !=
               (local_f8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
LAB_0012952c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
LAB_00128fad:
  __position._M_current =
       (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Edge*,std::allocator<Edge*>>::_M_realloc_insert<Edge*const&>
              ((vector<Edge*,std::allocator<Edge*>> *)&this->active_edges_,__position,&local_f8);
    _Var9._M_current =
         (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = local_f8;
    _Var9._M_current =
         (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
    super__Vector_impl_data._M_finish = _Var9._M_current;
  }
  __first._M_current =
       (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (__first._M_current != _Var9._M_current) {
    uVar10 = (long)_Var9._M_current - (long)__first._M_current >> 3;
    lVar6 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Edge_const*,Edge_const*)>>
              (__first,_Var9,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Edge_*,_const_Edge_*)>)0x148120);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Edge_const*,Edge_const*)>>
              (__first,_Var9,(_Iter_comp_iter<bool_(*)(const_Edge_*,_const_Edge_*)>)0x148120);
  }
  return true;
}

Assistant:

bool FakeCommandRunner::StartCommand(Edge* edge) {
  assert(active_edges_.size() < max_active_edges_);
  assert(find(active_edges_.begin(), active_edges_.end(), edge)
         == active_edges_.end());
  commands_ran_.push_back(edge->EvaluateCommand());
  if (edge->rule().name() == "cat"  ||
      edge->rule().name() == "cat_rsp" ||
      edge->rule().name() == "cat_rsp_out" ||
      edge->rule().name() == "cc" ||
      edge->rule().name() == "cp_multi_msvc" ||
      edge->rule().name() == "cp_multi_gcc" ||
      edge->rule().name() == "touch" ||
      edge->rule().name() == "touch-interrupt" ||
      edge->rule().name() == "touch-fail-tick2") {
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      fs_->Create((*out)->path(), "");
    }
  } else if (edge->rule().name() == "true" ||
             edge->rule().name() == "fail" ||
             edge->rule().name() == "interrupt" ||
             edge->rule().name() == "console") {
    // Don't do anything.
  } else if (edge->rule().name() == "cp") {
    assert(!edge->inputs_.empty());
    assert(edge->outputs_.size() == 1);
    string content;
    string err;
    if (fs_->ReadFile(edge->inputs_[0]->path(), &content, &err) ==
        DiskInterface::Okay)
      fs_->WriteFile(edge->outputs_[0]->path(), content);
  } else if (edge->rule().name() == "touch-implicit-dep-out") {
    string dep = edge->GetBinding("test_dependency");
    fs_->Create(dep, "");
    fs_->Tick();
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      fs_->Create((*out)->path(), "");
    }
  } else if (edge->rule().name() == "touch-out-implicit-dep") {
    string dep = edge->GetBinding("test_dependency");
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      fs_->Create((*out)->path(), "");
    }
    fs_->Tick();
    fs_->Create(dep, "");
  } else if (edge->rule().name() == "generate-depfile") {
    string dep = edge->GetBinding("test_dependency");
    string depfile = edge->GetUnescapedDepfile();
    string contents;
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      contents += (*out)->path() + ": " + dep + "\n";
      fs_->Create((*out)->path(), "");
    }
    fs_->Create(depfile, contents);
  } else {
    printf("unknown command\n");
    return false;
  }

  active_edges_.push_back(edge);

  // Allow tests to control the order by the name of the first output.
  sort(active_edges_.begin(), active_edges_.end(),
       CompareEdgesByOutput::cmp);

  return true;
}